

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IDeviceObject> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IDeviceObject>::operator=
          (RefCntAutoPtr<Diligent::IDeviceObject> *this,
          RefCntAutoPtr<Diligent::IDeviceObject> *AutoPtr)

{
  IDeviceObject *pObj;
  RefCntAutoPtr<Diligent::IDeviceObject> *AutoPtr_local;
  RefCntAutoPtr<Diligent::IDeviceObject> *this_local;
  
  if (this->m_pObject != AutoPtr->m_pObject) {
    pObj = Detach(AutoPtr);
    Attach(this,pObj);
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }